

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

Message * __thiscall
google::protobuf::Reflection::UnsafeArenaReleaseMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  ReflectionSchema *this_00;
  uint *puVar1;
  byte bVar2;
  Message *pMVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  MessageLite *pMVar6;
  OneofDescriptor *pOVar7;
  undefined8 *puVar8;
  Nonnull<const_char_*> pcVar9;
  bool bVar10;
  char *description;
  Descriptor *pDVar11;
  Metadata MVar12;
  
  MVar12 = Message::GetMetadata(message);
  if (MVar12.reflection != this) goto LAB_001f835d;
  pDVar11 = this->descriptor_;
  if (field->containing_type_ != pDVar11) {
    description = "Field does not match message type.";
    goto LAB_001f83ab;
  }
  bVar2 = field->field_0x1;
  bVar10 = (bool)((bVar2 & 0x20) >> 5);
  if (0xbf < bVar2 == bVar10) {
    pcVar9 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar9 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       (bVar10,0xbf < bVar2,
                        "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar9 == (Nonnull<const_char_*>)0x0) {
    if ((field->field_0x1 & 0x20) == 0) {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 10) {
        anon_unknown_6::ReportReflectionUsageTypeError
                  (this->descriptor_,field,"ReleaseMessage",CPPTYPE_MESSAGE);
      }
      bVar2 = field->field_0x1;
      if ((bVar2 & 8) != 0) {
        if (factory == (MessageFactory *)0x0) {
          factory = this->message_factory_;
        }
        uVar4 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
        pMVar6 = internal::ExtensionSet::UnsafeArenaReleaseMessage
                           ((ExtensionSet *)
                            ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),
                            field,factory);
        return (Message *)pMVar6;
      }
      bVar10 = (bool)((bVar2 & 0x20) >> 5);
      if (0xbf < bVar2 == bVar10) {
        pcVar9 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar9 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                           (bVar10,0xbf < bVar2,
                            "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      }
      if (pcVar9 != (Nonnull<const_char_*>)0x0) {
        UnsafeArenaReleaseMessage();
        goto LAB_001f83d7;
      }
      if ((field->field_0x1 & 0x20) == 0) {
        this_00 = &this->schema_;
        bVar10 = internal::ReflectionSchema::InRealOneof(this_00,field);
        if (bVar10) goto LAB_001f8214;
        if ((field->options_->field_0)._impl_.weak_ != true) {
          uVar4 = internal::ReflectionSchema::HasBitIndex(this_00,field);
          if (uVar4 != 0xffffffff) {
            if ((this->schema_).has_bits_offset_ == -1) goto LAB_001f8349;
            bVar2 = (byte)uVar4 & 0x1f;
            uVar5 = internal::ReflectionSchema::HasBitsOffset(this_00);
            puVar1 = (uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                             (ulong)(uVar4 >> 5) * 4 + (ulong)uVar5);
            *puVar1 = *puVar1 & (-2 << bVar2 | 0xfffffffeU >> 0x20 - bVar2);
          }
          goto LAB_001f8214;
        }
        UnsafeArenaReleaseMessage();
LAB_001f8349:
        UnsafeArenaReleaseMessage();
      }
      else {
LAB_001f8214:
        bVar10 = internal::ReflectionSchema::InRealOneof(&this->schema_,field);
        if (!bVar10) {
LAB_001f82d2:
          VerifyFieldType<google::protobuf::Message*>(this,field);
          puVar8 = (undefined8 *)MutableRawImpl(this,message,field);
          pMVar3 = (Message *)*puVar8;
          *puVar8 = 0;
          return pMVar3;
        }
        if ((field->field_0x1 & 0x10) == 0) {
          pOVar7 = (OneofDescriptor *)0x0;
        }
        else {
          pOVar7 = (field->scope_).containing_oneof;
          if (pOVar7 == (OneofDescriptor *)0x0) goto LAB_001f83d7;
        }
        uVar4 = GetOneofCase(this,message,pOVar7);
        if (uVar4 != field->number_) {
          return (Message *)0x0;
        }
        if ((field->field_0x1 & 0x10) == 0) {
          pOVar7 = (OneofDescriptor *)0x0;
        }
        else {
          pOVar7 = (field->scope_).containing_oneof;
          if (pOVar7 == (OneofDescriptor *)0x0) {
LAB_001f83d7:
            internal::protobuf_assumption_failed
                      ("res != nullptr",
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb31);
          }
        }
        if ((pOVar7->field_count_ != 1) || ((pOVar7->fields_->field_0x1 & 2) == 0)) {
          *(undefined4 *)
           ((long)&(message->super_MessageLite)._vptr_MessageLite +
           (ulong)(uint)((int)((ulong)((long)pOVar7 - (long)pOVar7->containing_type_->oneof_decls_)
                              >> 3) * -0x24924924 + (this->schema_).oneof_case_offset_)) = 0;
          goto LAB_001f82d2;
        }
      }
      UnsafeArenaReleaseMessage();
LAB_001f835d:
      pDVar11 = this->descriptor_;
      MVar12 = Message::GetMetadata(message);
      anon_unknown_6::ReportReflectionUsageMessageError
                (pDVar11,MVar12.descriptor,field,"ReleaseMessage");
    }
  }
  else {
    UnsafeArenaReleaseMessage();
  }
  pDVar11 = this->descriptor_;
  description = "Field is repeated; the method requires a singular field.";
LAB_001f83ab:
  anon_unknown_6::ReportReflectionUsageError(pDVar11,field,"ReleaseMessage",description);
}

Assistant:

Message* Reflection::UnsafeArenaReleaseMessage(Message* message,
                                               const FieldDescriptor* field,
                                               MessageFactory* factory) const {
  USAGE_MUTABLE_CHECK_ALL(ReleaseMessage, SINGULAR, MESSAGE);

  if (factory == nullptr) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->UnsafeArenaReleaseMessage(field,
                                                                factory));
  } else {
    if (!(field->is_repeated() || schema_.InRealOneof(field))) {
      ClearHasBit(message, field);
    }
    if (schema_.InRealOneof(field)) {
      if (HasOneofField(*message, field)) {
        *MutableOneofCase(message, field->containing_oneof()) = 0;
      } else {
        return nullptr;
      }
    }
    Message** result = MutableRaw<Message*>(message, field);
    Message* ret = *result;
    *result = nullptr;
    return ret;
  }
}